

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.h
# Opt level: O0

void __thiscall btGImpactMeshShapePart::TrimeshPrimitiveManager::lock(TrimeshPrimitiveManager *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x2c) < 1) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))
              (*(long **)(in_RDI + 0x10),in_RDI + 0x30,in_RDI + 0x38,in_RDI + 0x3c,in_RDI + 0x40,
               in_RDI + 0x48,in_RDI + 0x50,in_RDI + 0x54,in_RDI + 0x58,
               *(undefined4 *)(in_RDI + 0x28));
    *(undefined4 *)(in_RDI + 0x2c) = 1;
  }
  else {
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
  }
  return;
}

Assistant:

void lock()
		{
			if(m_lock_count>0)
			{
				m_lock_count++;
				return;
			}
			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,numverts,
				type, stride,&indexbase, indexstride, numfaces,indicestype,m_part);

			m_lock_count = 1;
		}